

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O2

bool __thiscall ArmParser::matchSymbol(ArmParser *this,Parser *parser,char symbol,bool optional)

{
  bool bVar1;
  int iVar2;
  undefined7 in_register_00000011;
  undefined4 uStack_8;
  
  iVar2 = (int)CONCAT71(in_register_00000011,symbol);
  if (iVar2 == 0x21) {
    uStack_8 = Exclamation;
  }
  else if (iVar2 == 0x23) {
    uStack_8 = Hash;
  }
  else if (iVar2 == 0x2b) {
    uStack_8 = Plus;
  }
  else if (iVar2 == 0x2c) {
    uStack_8 = Comma;
  }
  else if (iVar2 == 0x3d) {
    uStack_8 = Assign;
  }
  else if (iVar2 == 0x5b) {
    uStack_8 = LBrack;
  }
  else if (iVar2 == 0x7d) {
    uStack_8 = RBrace;
  }
  else if (iVar2 == 0x7b) {
    uStack_8 = LBrace;
  }
  else {
    if (iVar2 != 0x5d) {
      return false;
    }
    uStack_8 = RBrack;
  }
  bVar1 = Parser::matchToken(parser,uStack_8,optional);
  return bVar1;
}

Assistant:

bool ArmParser::matchSymbol(Parser& parser, char symbol, bool optional)
{
	switch (symbol)
	{
	case '[':
		return parser.matchToken(TokenType::LBrack,optional);
	case ']':
		return parser.matchToken(TokenType::RBrack,optional);
	case ',':
		return parser.matchToken(TokenType::Comma,optional);
	case '!':
		return parser.matchToken(TokenType::Exclamation,optional);
	case '{':
		return parser.matchToken(TokenType::LBrace,optional);
	case '}':
		return parser.matchToken(TokenType::RBrace,optional);
	case '#':
		return parser.matchToken(TokenType::Hash,optional);
	case '=':
		return parser.matchToken(TokenType::Assign,optional);
	case '+':
		return parser.matchToken(TokenType::Plus,optional);
	}

	return false;
}